

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O2

int run_test_tcp_open_connected(void)

{
  int iVar1;
  uv_os_sock_t __fd;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_b_2;
  uv_buf_t buf;
  sockaddr_in addr;
  uv_tcp_t client;
  
  buf = uv_buf_init("PING",4);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  client.data = (void *)(long)iVar1;
  if (client.data == (void *)0x0) {
    __fd = create_tcp_socket();
    iVar1 = connect(__fd,(sockaddr *)&addr,0x10);
    client.data = (void *)(long)iVar1;
    if (client.data == (void *)0x0) {
      puVar2 = uv_default_loop();
      iVar1 = uv_tcp_init(puVar2,&client);
      eval_b = (int64_t)iVar1;
      eval_b_2 = 0;
      if ((void *)eval_b == (void *)0x0) {
        iVar1 = uv_tcp_open(&client,__fd);
        eval_b = (int64_t)iVar1;
        eval_b_2 = 0;
        if ((void *)eval_b == (void *)0x0) {
          iVar1 = uv_write(&write_req,(uv_stream_t *)&client,&buf,1,write_cb);
          eval_b = (int64_t)iVar1;
          eval_b_2 = 0;
          if ((void *)eval_b == (void *)0x0) {
            iVar1 = uv_shutdown(&shutdown_req,(uv_stream_t *)&client,shutdown_cb);
            eval_b = (int64_t)iVar1;
            eval_b_2 = 0;
            if ((void *)eval_b == (void *)0x0) {
              iVar1 = uv_read_start((uv_stream_t *)&client,alloc_cb,read_cb);
              eval_b = (int64_t)iVar1;
              eval_b_2 = 0;
              if ((void *)eval_b == (void *)0x0) {
                puVar2 = uv_default_loop();
                uv_run(puVar2,UV_RUN_DEFAULT);
                eval_b = 1;
                eval_b_2 = (int64_t)shutdown_cb_called;
                if (eval_b_2 == 1) {
                  eval_b = 1;
                  eval_b_2 = (int64_t)write_cb_called;
                  if (eval_b_2 == 1) {
                    eval_b = 1;
                    eval_b_2 = (int64_t)close_cb_called;
                    if (eval_b_2 == 1) {
                      puVar2 = uv_default_loop();
                      close_loop(puVar2);
                      eval_b = 0;
                      puVar2 = uv_default_loop();
                      iVar1 = uv_loop_close(puVar2);
                      eval_b_2 = (int64_t)iVar1;
                      if (eval_b_2 == 0) {
                        uv_library_shutdown();
                        return 0;
                      }
                      pcVar5 = "uv_loop_close(uv_default_loop())";
                      pcVar4 = "0";
                      uVar3 = 0x172;
                    }
                    else {
                      pcVar5 = "close_cb_called";
                      pcVar4 = "1";
                      uVar3 = 0x170;
                    }
                  }
                  else {
                    pcVar5 = "write_cb_called";
                    pcVar4 = "1";
                    uVar3 = 0x16f;
                  }
                }
                else {
                  pcVar5 = "shutdown_cb_called";
                  pcVar4 = "1";
                  uVar3 = 0x16e;
                }
              }
              else {
                pcVar5 = "0";
                pcVar4 = "uv_read_start((uv_stream_t*) &client, alloc_cb, read_cb)";
                uVar3 = 0x16a;
              }
            }
            else {
              pcVar5 = "0";
              pcVar4 = "uv_shutdown(&shutdown_req, (uv_stream_t*) &client, shutdown_cb)";
              uVar3 = 0x168;
            }
          }
          else {
            pcVar5 = "0";
            pcVar4 = "uv_write(&write_req, (uv_stream_t*) &client, &buf, 1, write_cb)";
            uVar3 = 0x164;
          }
        }
        else {
          pcVar5 = "0";
          pcVar4 = "uv_tcp_open(&client, sock)";
          uVar3 = 0x15e;
        }
      }
      else {
        pcVar5 = "0";
        pcVar4 = "uv_tcp_init(uv_default_loop(), &client)";
        uVar3 = 0x15c;
      }
      goto LAB_00188e66;
    }
    pcVar4 = "connect(sock, (struct sockaddr*) &addr, sizeof(addr))";
    uVar3 = 0x15a;
  }
  else {
    pcVar4 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
    uVar3 = 0x155;
  }
  pcVar5 = "0";
  eval_b_2 = 0;
  eval_b = (int64_t)client.data;
LAB_00188e66:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-open.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_b,"==",eval_b_2);
  abort();
}

Assistant:

TEST_IMPL(tcp_open_connected) {
  struct sockaddr_in addr;
  uv_tcp_t client;
  uv_os_sock_t sock;
  uv_buf_t buf = uv_buf_init("PING", 4);

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  startup();
  sock = create_tcp_socket();

  ASSERT_OK(connect(sock, (struct sockaddr*) &addr,  sizeof(addr)));

  ASSERT_OK(uv_tcp_init(uv_default_loop(), &client));

  ASSERT_OK(uv_tcp_open(&client, sock));

  ASSERT_OK(uv_write(&write_req,
                     (uv_stream_t*) &client,
                     &buf,
                     1,
                     write_cb));

  ASSERT_OK(uv_shutdown(&shutdown_req,
                        (uv_stream_t*) &client,
                        shutdown_cb));

  ASSERT_OK(uv_read_start((uv_stream_t*) &client, alloc_cb, read_cb));

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, shutdown_cb_called);
  ASSERT_EQ(1, write_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}